

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

SerializedModel * __thiscall CoreML::Specification::Model::mutable_serializedmodel(Model *this)

{
  SerializedModel *this_00;
  
  if (this->_oneof_case_[0] == 3000) {
    this_00 = (SerializedModel *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 3000;
    this_00 = (SerializedModel *)operator_new(0x28);
    SerializedModel::SerializedModel(this_00);
    (this->Type_).serializedmodel_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SerializedModel* Model::mutable_serializedmodel() {
  if (!has_serializedmodel()) {
    clear_Type();
    set_has_serializedmodel();
    Type_.serializedmodel_ = new ::CoreML::Specification::SerializedModel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.serializedModel)
  return Type_.serializedmodel_;
}